

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_set_source_membership6
              (uv_udp_t *handle,sockaddr_in6 *multicast_addr,char *interface_addr,
              sockaddr_in6 *source_addr,uv_membership membership)

{
  int iVar1;
  int *piVar2;
  int local_160;
  int err;
  int optname;
  sockaddr_in6 addr6;
  group_source_req mreq;
  uv_membership membership_local;
  sockaddr_in6 *source_addr_local;
  char *interface_addr_local;
  sockaddr_in6 *multicast_addr_local;
  uv_udp_t *handle_local;
  
  handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,10,4);
  if (handle_local._4_4_ == 0) {
    memset((void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0,0x108);
    if (interface_addr == (char *)0x0) {
      addr6.sin6_addr.__in6_u.__u6_addr32[3] = 0;
    }
    else {
      iVar1 = uv_ip6_addr(interface_addr,0,(sockaddr_in6 *)&err);
      if (iVar1 != 0) {
        return iVar1;
      }
      addr6.sin6_addr.__in6_u.__u6_addr32[3] = addr6.sin6_addr.__in6_u.__u6_addr32[2];
    }
    if (membership == UV_JOIN_GROUP) {
      local_160 = 0x2e;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      local_160 = 0x2f;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,local_160,
                       (void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0x108);
    if (iVar1 == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_set_source_membership6(uv_udp_t* handle,
                                          const struct sockaddr_in6* multicast_addr,
                                          const char* interface_addr,
                                          const struct sockaddr_in6* source_addr,
                                          uv_membership membership) {
  struct group_source_req mreq;
  struct sockaddr_in6 addr6;
  int optname;
  int err;

  err = uv__udp_maybe_deferred_bind(handle, AF_INET6, UV_UDP_REUSEADDR);
  if (err)
    return err;

  memset(&mreq, 0, sizeof(mreq));

  if (interface_addr != NULL) {
    err = uv_ip6_addr(interface_addr, 0, &addr6);
    if (err)
      return err;
    mreq.gsr_interface = addr6.sin6_scope_id;
  } else {
    mreq.gsr_interface = 0;
  }

  STATIC_ASSERT(sizeof(mreq.gsr_group) >= sizeof(*multicast_addr));
  STATIC_ASSERT(sizeof(mreq.gsr_source) >= sizeof(*source_addr));
  memcpy(&mreq.gsr_group, multicast_addr, sizeof(*multicast_addr));
  memcpy(&mreq.gsr_source, source_addr, sizeof(*source_addr));

  if (membership == UV_JOIN_GROUP)
    optname = MCAST_JOIN_SOURCE_GROUP;
  else if (membership == UV_LEAVE_GROUP)
    optname = MCAST_LEAVE_SOURCE_GROUP;
  else
    return UV_EINVAL;

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IPV6,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
    return UV__ERR(errno);
  }

  return 0;
}